

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O0

void __thiscall particleSamples::filter_particles_from_events(particleSamples *this,int PoI_monval)

{
  int in_ESI;
  long in_RDI;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *in_stack_00000058;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *in_stack_00000060;
  int in_stack_0000006c;
  particleSamples *in_stack_00000070;
  particleSamples *in_stack_000000e0;
  
  filter_particles(in_stack_00000070,in_stack_0000006c,in_stack_00000060,in_stack_00000058);
  if (*(int *)(in_RDI + 0x638) == 1) {
    if (in_ESI == 0xc32) {
      filter_particles(in_stack_00000070,in_stack_0000006c,in_stack_00000060,in_stack_00000058);
    }
    else if (in_ESI == -0xc32) {
      filter_particles(in_stack_00000070,in_stack_0000006c,in_stack_00000060,in_stack_00000058);
    }
  }
  if (*(int *)(in_RDI + 0x640) == 1) {
    filter_particles(in_stack_00000070,in_stack_0000006c,in_stack_00000060,in_stack_00000058);
  }
  if ((*(int *)(in_RDI + 0x63c) == 1) && (in_ESI == 0x14d)) {
    filter_particles(in_stack_00000070,in_stack_0000006c,in_stack_00000060,in_stack_00000058);
    filter_particles(in_stack_00000070,in_stack_0000006c,in_stack_00000060,in_stack_00000058);
    perform_particle_reconstruction(in_stack_000000e0);
  }
  if ((*(int *)(in_RDI + 0x648) == 1) && (in_ESI == 9999)) {
    filter_particles(in_stack_00000070,in_stack_0000006c,in_stack_00000060,in_stack_00000058);
    filter_particles(in_stack_00000070,in_stack_0000006c,in_stack_00000060,in_stack_00000058);
  }
  if ((*(byte *)(in_RDI + 0x60b) & 1) != 0) {
    filter_particles(in_stack_00000070,in_stack_0000006c,in_stack_00000060,in_stack_00000058);
    filter_particles(in_stack_00000070,in_stack_0000006c,in_stack_00000060,in_stack_00000058);
    filter_particles(in_stack_00000070,in_stack_0000006c,in_stack_00000060,in_stack_00000058);
    filter_particles(in_stack_00000070,in_stack_0000006c,in_stack_00000060,in_stack_00000058);
  }
  return;
}

Assistant:

void particleSamples::filter_particles_from_events(const int PoI_monval) {
    filter_particles(PoI_monval, full_particle_list, particle_list);

    if (resonance_weak_feed_down_Sigma_to_Lambda_flag == 1) {
        if (PoI_monval == 3122) {
            filter_particles(3212, full_particle_list, resonance_list_Sigma0);
        } else if (PoI_monval == -3122) {
            filter_particles(-3212, full_particle_list, resonance_list_Sigma0);
        }
    }

    if (net_particle_flag == 1) {
        filter_particles(-PoI_monval, full_particle_list, anti_particle_list);
    }

    if (reconst_flag == 1 && PoI_monval == 333) {
        filter_particles(321, full_particle_list, reconst_list_1);
        filter_particles(-321, full_particle_list, reconst_list_2);
        perform_particle_reconstruction();
    }

    if (flag_charge_dependence == 1 && PoI_monval == 9999) {
        filter_particles(9998, full_particle_list, positive_charge_hadron_list);
        filter_particles(
            -9998, full_particle_list, negative_charge_hadron_list);
    }

    if (analyze_BF) {
        filter_particles(
            particle_monval_a, full_particle_list, balance_function_particle_a);
        filter_particles(
            particle_monval_abar, full_particle_list,
            balance_function_particle_abar);
        filter_particles(
            particle_monval_b, full_particle_list, balance_function_particle_b);
        filter_particles(
            particle_monval_bbar, full_particle_list,
            balance_function_particle_bbar);
    }
}